

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O2

vector<ItemInfo,_std::allocator<ItemInfo>_> * __thiscall
MapInfo::getAllMapInfo
          (vector<ItemInfo,_std::allocator<ItemInfo>_> *__return_storage_ptr__,MapInfo *this)

{
  undefined8 uVar1;
  MapInfo *pMVar2;
  _List_node_base *p_Var3;
  ItemInfo w;
  value_type local_68;
  value_type local_48;
  
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = this;
  while (pMVar2 = (MapInfo *)
                  (pMVar2->wards).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                  _M_node.super__List_node_base._M_next, pMVar2 != this) {
    local_68._0_8_ =
         (pMVar2->wards).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
         _M_size;
    local_48.pos = (Vec2)(pMVar2->bombs).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>.
                         _M_impl._M_node.super__List_node_base._M_next;
    uVar1 = *(undefined8 *)
             ((long)&(pMVar2->bombs).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                     _M_node.super__List_node_base._M_prev + 4);
    local_68.velocity.x =
         (float)((ulong)*(undefined8 *)
                         ((long)&(pMVar2->bombs).
                                 super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                                 _M_node.super__List_node_base._M_next + 4) >> 0x20);
    local_68.velocity.y = (float)uVar1;
    local_68.life = (int)((ulong)uVar1 >> 0x20);
    local_68.pos.x = local_48.pos.x;
    local_68.pos.y = local_48.pos.y;
    local_48.velocity.y = local_68.velocity.y;
    local_48.velocity.x = local_68.velocity.x;
    local_48.life = 0;
    local_48._0_8_ = local_68._0_8_;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back(__return_storage_ptr__,&local_48);
  }
  p_Var3 = (_List_node_base *)&this->bombs;
  while (p_Var3 = (((_List_base<ItemInfo,_std::allocator<ItemInfo>_> *)&p_Var3->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)&this->bombs)
  {
    local_48.velocity = (Vec2)p_Var3[2]._M_next;
    local_68._0_8_ = p_Var3[1]._M_next;
    local_48.pos = (Vec2)p_Var3[1]._M_prev;
    local_68.life = *(int *)&p_Var3[2]._M_prev;
    local_68.velocity.x = local_48.velocity.x;
    local_68.velocity.y = local_48.velocity.y;
    local_68.pos.x = local_48.pos.x;
    local_68.pos.y = local_48.pos.y;
    local_48._0_8_ = local_68._0_8_;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back(__return_storage_ptr__,&local_68);
  }
  p_Var3 = (_List_node_base *)&this->deaths;
  while (p_Var3 = (((_List_base<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&this->deaths) {
    uVar1 = *(undefined8 *)((long)&p_Var3[1]._M_next + 4);
    local_68.velocity.x = 0.0;
    local_68.velocity.y = 0.0;
    local_68.id = *(undefined4 *)&p_Var3[1]._M_next;
    local_68.pos.x = (float)uVar1;
    local_68.pos.y = (float)((ulong)uVar1 >> 0x20);
    local_68.life = 2;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back(__return_storage_ptr__,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ItemInfo> MapInfo::getAllMapInfo()
{
    vector<ItemInfo> res;
    //Use life as the type
    for (auto w : wards)
    {
        ItemInfo i = w;
        i.life = 0;
        res.push_back(i);
    }
    for (auto b : bombs)
    {
        ItemInfo i = b;
        b.life = 1;
        res.push_back(i);
    }
    for (auto c : deaths)
    {
        ItemInfo i;
        i.id = c.id;
        i.pos = c.pos;
        i.life = 2;
        res.push_back(i);
    }
    return res;
}